

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O2

void UIEngine(shared_ptr<ApplicationContextBase> *context)

{
  ApplicationContextBase *context_00;
  
  while (((context->super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
         ->join_now == false) {
    glfwWaitEventsTimeout(0.0416666679084301);
    context_00 = (context->super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
    UIContext::Render((context_00->ui).super___shared_ptr<UIContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,context_00);
    (*((context->super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_ApplicationContextBase[3])();
  }
  return;
}

Assistant:

void UIEngine(std::shared_ptr<ApplicationContextBase> context)
{
    while (!context->join_now)
    {
        // if the graphics viewport is not actively rendering, update at 24hz
        // When the render engine is in place, and has an animation mode,
        // this timeout should be set appropriately to the intended frame rate.
        // We'll come back to this later.
        glfwWaitEventsTimeout(1.f / 24.f);
        context->ui->Render(*context.get());
        context->Update();
    }
}